

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O1

void __thiscall HighsSimplexAnalysis::reportAlgorithmPhase(HighsSimplexAnalysis *this,bool header)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  char *pcVar2;
  undefined7 in_register_00000031;
  string algorithm_name;
  string local_58;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  if ((int)CONCAT71(in_register_00000031,header) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               ((this->analysis_log)._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl + 0x10),"     ",5);
    return;
  }
  local_30 = 0;
  local_28[0] = 0;
  pcVar2 = "Pr";
  if (this->simplex_strategy - 1U < 3) {
    pcVar2 = "Du";
  }
  local_38 = local_28;
  std::__cxx11::string::_M_replace((ulong)&local_38,0,(char *)0x0,(ulong)pcVar2);
  pbVar1 = (this->analysis_log)._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  highsFormatToString_abi_cxx11_(&local_58,"%2sPh%1d",local_38,(ulong)(uint)this->solve_phase);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(pbVar1 + 0x10),local_58._M_dataplus._M_p,local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::reportAlgorithmPhase(const bool header) {
  if (header) {
    *analysis_log << "     ";
  } else {
    std::string algorithm_name;
    if (dualAlgorithm()) {
      algorithm_name = "Du";
    } else {
      algorithm_name = "Pr";
    }
    *analysis_log << highsFormatToString("%2sPh%1" HIGHSINT_FORMAT,
                                         algorithm_name.c_str(), solve_phase);
  }
}